

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O1

void SUNMatDestroy_Dense(SUNMatrix A)

{
  void *pvVar1;
  
  free(*(void **)((long)A->content + 0x10));
  pvVar1 = A->content;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  free(*(void **)((long)pvVar1 + 0x20));
  pvVar1 = A->content;
  *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  free(pvVar1);
  A->content = (void *)0x0;
  free(A->ops);
  A->ops = (_generic_SUNMatrix_Ops *)0x0;
  free(A);
  return;
}

Assistant:

void SUNMatDestroy_Dense(SUNMatrix A)
{
  /* perform operation */
  free(SM_DATA_D(A));  SM_DATA_D(A) = NULL;
  free(SM_CONTENT_D(A)->cols);  SM_CONTENT_D(A)->cols = NULL;
  free(A->content);  A->content = NULL;
  free(A->ops);  A->ops = NULL;
  free(A); A = NULL;
  return;
}